

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate(QMetaMethodBuilderPrivate *this)

{
  QByteArray::~QByteArray((QByteArray *)0x37a620);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x37a62e);
  QByteArray::~QByteArray((QByteArray *)0x37a63c);
  QByteArray::~QByteArray((QByteArray *)0x37a646);
  return;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }